

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUPlugin.cpp
# Opt level: O2

void __thiscall beagle::cpu::BeagleCPUPlugin::BeagleCPUPlugin(BeagleCPUPlugin *this)

{
  list<beagle::BeagleImplFactory_*,_std::allocator<beagle::BeagleImplFactory_*>_> *this_00;
  value_type local_38;
  BeagleResource resource;
  
  plugin::Plugin::Plugin(&this->super_Plugin,"CPU","CPU");
  (this->super_Plugin)._vptr_Plugin = (_func_int **)&PTR_pluginName_abi_cxx11__00158568;
  resource.name = "CPU (x86_64)";
  resource.description = "";
  resource.supportFlags = -0x35cf2809;
  resource.requiredFlags = 0x8000000;
  std::__cxx11::list<BeagleResource,_std::allocator<BeagleResource>_>::push_back
            (&(this->super_Plugin).beagleResources,&resource);
  local_38 = (value_type)operator_new(8);
  this_00 = &(this->super_Plugin).beagleFactories;
  local_38->_vptr_BeagleImplFactory = (_func_int **)&PTR_createImpl_001585f0;
  std::__cxx11::list<beagle::BeagleImplFactory_*,_std::allocator<beagle::BeagleImplFactory_*>_>::
  push_back(this_00,&local_38);
  local_38 = (value_type)operator_new(8);
  local_38->_vptr_BeagleImplFactory = (_func_int **)&PTR_createImpl_001590e8;
  std::__cxx11::list<beagle::BeagleImplFactory_*,_std::allocator<beagle::BeagleImplFactory_*>_>::
  push_back(this_00,&local_38);
  local_38 = (value_type)operator_new(8);
  local_38->_vptr_BeagleImplFactory = (_func_int **)&PTR_createImpl_00159aa8;
  std::__cxx11::list<beagle::BeagleImplFactory_*,_std::allocator<beagle::BeagleImplFactory_*>_>::
  push_back(this_00,&local_38);
  local_38 = (value_type)operator_new(8);
  local_38->_vptr_BeagleImplFactory = (_func_int **)&PTR_createImpl_00159ae8;
  std::__cxx11::list<beagle::BeagleImplFactory_*,_std::allocator<beagle::BeagleImplFactory_*>_>::
  push_back(this_00,&local_38);
  return;
}

Assistant:

BeagleCPUPlugin::BeagleCPUPlugin() :
Plugin("CPU", "CPU")
{
	BeagleResource resource;
#ifdef __aarch64__
	    resource.name = (char*) "CPU (arm64)";
#else
        resource.name = (char*) "CPU (x86_64)";
#endif
        resource.description = (char*) "";
        resource.supportFlags = BEAGLE_FLAG_COMPUTATION_SYNCH |
                                         BEAGLE_FLAG_SCALING_MANUAL | BEAGLE_FLAG_SCALING_ALWAYS | BEAGLE_FLAG_SCALING_AUTO | BEAGLE_FLAG_SCALING_DYNAMIC |
                                         BEAGLE_FLAG_THREADING_NONE | BEAGLE_FLAG_THREADING_CPP |
                                         BEAGLE_FLAG_PROCESSOR_CPU |
                                         BEAGLE_FLAG_PRECISION_SINGLE | BEAGLE_FLAG_PRECISION_DOUBLE |
                                         BEAGLE_FLAG_VECTOR_NONE |
                                         BEAGLE_FLAG_SCALERS_LOG | BEAGLE_FLAG_SCALERS_RAW |
                                         BEAGLE_FLAG_EIGEN_COMPLEX | BEAGLE_FLAG_EIGEN_REAL |
                                         BEAGLE_FLAG_INVEVEC_STANDARD | BEAGLE_FLAG_INVEVEC_TRANSPOSED |
                                         BEAGLE_FLAG_PREORDER_TRANSPOSE_MANUAL | BEAGLE_FLAG_PREORDER_TRANSPOSE_AUTO |
                                         BEAGLE_FLAG_FRAMEWORK_CPU;
        resource.requiredFlags = BEAGLE_FLAG_FRAMEWORK_CPU;
	beagleResources.push_back(resource);

	// Optional for plugins: check if the hardware is compatible and only populate
	// list with compatible factories
	beagleFactories.push_back(new beagle::cpu::BeagleCPU4StateImplFactory<double>());
	beagleFactories.push_back(new beagle::cpu::BeagleCPU4StateImplFactory<float>());
	beagleFactories.push_back(new beagle::cpu::BeagleCPUImplFactory<double>());
	beagleFactories.push_back(new beagle::cpu::BeagleCPUImplFactory<float>());
}